

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

string * __thiscall Regex::getData_abi_cxx11_(Regex *this,int i)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  GroupData *pGVar4;
  allocator<char> local_1d;
  uint local_1c;
  Regex *pRStack_18;
  int i_local;
  Regex *this_local;
  
  local_1c = i;
  pRStack_18 = this;
  if (getData[abi:cxx11](int)::null_string_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&getData[abi:cxx11](int)::null_string_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&getData[abi:cxx11](int)::null_string_abi_cxx11_,"",&local_1d);
      std::allocator<char>::~allocator(&local_1d);
      __cxa_atexit(std::__cxx11::string::~string,&getData[abi:cxx11](int)::null_string_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getData[abi:cxx11](int)::null_string_abi_cxx11_);
    }
  }
  uVar1 = local_1c;
  if (this->mState == STATE_PARSED) {
    uVar3 = JetHead::vector<Regex::GroupData>::size(&this->mGroups);
    if ((int)uVar1 < (int)uVar3) {
      pGVar4 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,local_1c);
      this_local = (Regex *)&pGVar4->string;
    }
    else {
      this_local = (Regex *)&getData[abi:cxx11](int)::null_string_abi_cxx11_;
    }
  }
  else {
    this_local = (Regex *)&getData[abi:cxx11](int)::null_string_abi_cxx11_;
  }
  return (string *)this_local;
}

Assistant:

const JHSTD::string &Regex::getData( int i )
{
	static JHSTD::string null_string( "" );

	if ( mState != Regex::STATE_PARSED )
		return null_string;

	if ( i >= (int)mGroups.size() )
		return null_string;

	return mGroups[ i ].string;
}